

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffhdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
             int *status)

{
  int iVar1;
  void *pvVar2;
  char *local_160;
  char *headptr;
  char keyname [75];
  char keybuf [162];
  long jj;
  long ii;
  int totkeys;
  int exact;
  int match;
  int casesn;
  int *nkeys_local;
  char **header_local;
  char **ppcStack_28;
  int nexc_local;
  char **exclist_local;
  fitsfile *pfStack_18;
  int exclude_comm_local;
  fitsfile *fptr_local;
  
  *nkeys = 0;
  if (*status < 1) {
    _match = nkeys;
    nkeys_local = (int *)header;
    header_local._4_4_ = nexc;
    ppcStack_28 = exclist;
    exclist_local._4_4_ = exclude_comm;
    pfStack_18 = fptr;
    iVar1 = ffghsp(fptr,(int *)&ii,(int *)0x0,status);
    if (iVar1 < 1) {
      pvVar2 = calloc((long)(((int)ii + 1) * 0x50 + 1),1);
      *(void **)nkeys_local = pvVar2;
      if (*(long *)nkeys_local == 0) {
        *status = 0x71;
        ffpmsg("failed to allocate memory to hold all the header keywords");
        fptr_local._4_4_ = *status;
      }
      else {
        local_160 = *(char **)nkeys_local;
        exact = 0;
        for (jj = 1; jj <= (int)ii; jj = jj + 1) {
          ffgrec(pfStack_18,(int)jj,keyname + 0x48,status);
          strcat(keyname + 0x48,
                 "                                                                                ")
          ;
          headptr._0_1_ = '\0';
          strncat((char *)&headptr,keyname + 0x48,8);
          if ((exclist_local._4_4_ == 0) ||
             ((((('C' < (char)headptr || ((char)headptr < 'C')) ||
                (iVar1 = strcmp("COMMENT ",(char *)&headptr), iVar1 != 0)) &&
               ((('H' < (char)headptr || ((char)headptr < 'H')) ||
                (iVar1 = strcmp("HISTORY ",(char *)&headptr), iVar1 != 0)))) &&
              (((' ' < (char)headptr || ((char)headptr < ' ')) ||
               (iVar1 = strcmp("        ",(char *)&headptr), iVar1 != 0)))))) {
            stack0xffffffffffffffa0 = 0;
            while ((stack0xffffffffffffffa0 < header_local._4_4_ &&
                   (ffcmps(ppcStack_28[stack0xffffffffffffffa0],(char *)&headptr,exact,&totkeys,
                           (int *)((long)&ii + 4)), totkeys == 0))) {
              register0x00000000 = stack0xffffffffffffffa0 + 1;
            }
            if (stack0xffffffffffffffa0 == header_local._4_4_) {
              strcpy(local_160,keyname + 0x48);
              local_160 = local_160 + 0x50;
              *_match = *_match + 1;
            }
          }
        }
        strcpy(local_160,
               "END                                                                             ");
        *_match = *_match + 1;
        local_160[0x50] = '\0';
        pvVar2 = realloc(*(void **)nkeys_local,(long)(*_match * 0x50 + 1));
        *(void **)nkeys_local = pvVar2;
        fptr_local._4_4_ = *status;
      }
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffhdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.  If exclude_comm is TRUE, then all 
  the COMMENT, HISTORY, and <blank> keywords will be excluded from the output
  string of keywords.  Any other list of keywords to be excluded may be
  specified with the exclist parameter.
*/
{
    int casesn, match, exact, totkeys;
    long ii, jj;
    char keybuf[162], keyname[FLEN_KEYWORD], *headptr;

    *nkeys = 0;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &totkeys, NULL, status) > 0)
        return(*status);

    /* allocate memory for all the keywords */
    /* (will reallocate it later to minimize the memory size) */
    
    *header = (char *) calloc ( (totkeys + 1) * 80 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    headptr = *header;
    casesn = FALSE;

    /* read every keyword */
    for (ii = 1; ii <= totkeys; ii++) 
    {
        ffgrec(fptr, ii, keybuf, status);
        /* pad record with blanks so that it is at least 80 chars long */
        strcat(keybuf,
    "                                                                                ");

        keyname[0] = '\0';
        strncat(keyname, keybuf, 8); /* copy the keyword name */
        
        if (exclude_comm)
        {
            if (!FSTRCMP("COMMENT ", keyname) ||
                !FSTRCMP("HISTORY ", keyname) ||
                !FSTRCMP("        ", keyname) )
              continue;  /* skip this commentary keyword */
        }

        /* does keyword match any names in the exclusion list? */
        for (jj = 0; jj < nexc; jj++ )
        {
            ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                 if (match)
                     break;
        }

        if (jj == nexc)
        {
            /* not in exclusion list, add this keyword to the string */
            strcpy(headptr, keybuf);
            headptr += 80;
            (*nkeys)++;
        }
    }

    /* add the END keyword */
    strcpy(headptr,
    "END                                                                             ");
    headptr += 80;
    (*nkeys)++;

    *headptr = '\0';   /* terminate the header string */
    /* minimize the allocated memory */
    *header = (char *) realloc(*header, (*nkeys *80) + 1);  

    return(*status);
}